

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harvest.cc
# Opt level: O0

void sptk::world::anon_unknown_2::GetRawF0Candidates
               (double *boundary_f0_list,int number_of_bands,double actual_fs,int y_length,
               double *temporal_positions,int f0_length,fft_complex *y_spectrum,int fft_size,
               double f0_floor,double f0_ceil,double **raw_f0_candidates)

{
  int in_ESI;
  int i;
  undefined4 in_stack_00000028;
  int in_stack_00000038;
  undefined4 in_stack_00000048;
  undefined4 local_4c;
  
  for (local_4c = 0; local_4c < in_ESI; local_4c = local_4c + 1) {
    GetF0CandidateFromRawEvent
              ((double)boundary_f0_list,(double)CONCAT44(number_of_bands,in_stack_00000048),
               (fft_complex *)actual_fs,y_length,in_stack_00000038,(double)temporal_positions,
               (double)CONCAT44(f0_length,in_stack_00000028),*y_spectrum,f0_floor._4_4_,
               (double *)f0_ceil);
  }
  return;
}

Assistant:

static void GetRawF0Candidates(const double *boundary_f0_list,
    int number_of_bands, double actual_fs, int y_length,
    const double *temporal_positions, int f0_length,
    const fft_complex *y_spectrum, int fft_size, double f0_floor,
    double f0_ceil, double **raw_f0_candidates) {
  for (int i = 0; i < number_of_bands; ++i)
    GetF0CandidateFromRawEvent(boundary_f0_list[i], actual_fs, y_spectrum,
        y_length, fft_size, f0_floor, f0_ceil, temporal_positions, f0_length,
        raw_f0_candidates[i]);
}